

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestResult::RecordProperty(TestResult *this,TestProperty *test_property)

{
  bool bVar1;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  this_00;
  pointer this_01;
  iterator property_with_matching_key;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffff68;
  TestPropertyKeyIs *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  TestPropertyKeyIs *in_stack_ffffffffffffffb8;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  in_stack_ffffffffffffffc8;
  TestProperty *in_stack_ffffffffffffffd8;
  __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
  local_20 [4];
  
  bVar1 = ValidateTestProperty(in_stack_ffffffffffffffd8);
  if (bVar1) {
    internal::GTestMutexLock::GTestMutexLock
              ((GTestMutexLock *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::begin
              ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
               in_stack_ffffffffffffff68);
    std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
              ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
               in_stack_ffffffffffffff68);
    TestProperty::key((TestProperty *)0x1ed5c0);
    internal::TestPropertyKeyIs::TestPropertyKeyIs
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    this_00 = std::
              find_if<__gnu_cxx::__normal_iterator<testing::TestProperty*,std::vector<testing::TestProperty,std::allocator<testing::TestProperty>>>,testing::internal::TestPropertyKeyIs>
                        (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
    local_20[0] = this_00;
    internal::TestPropertyKeyIs::~TestPropertyKeyIs((TestPropertyKeyIs *)0x1ed607);
    std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::end
              ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
               in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                        *)in_stack_ffffffffffffff68);
    if (bVar1) {
      std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::push_back
                ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
                 this_00._M_current,in_stack_ffffffffffffff78);
    }
    else {
      this_01 = __gnu_cxx::
                __normal_iterator<testing::TestProperty_*,_std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>_>
                ::operator->(local_20);
      TestProperty::value((TestProperty *)0x1ed697);
      TestProperty::SetValue(this_01,(char *)in_stack_ffffffffffffff68);
    }
    internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1ed6c4);
  }
  return;
}

Assistant:

void TestResult::RecordProperty(const TestProperty& test_property) {
  if (!ValidateTestProperty(test_property)) {
    return;
  }
  internal::MutexLock lock(&test_properites_mutex_);
  const std::vector<TestProperty>::iterator property_with_matching_key =
      std::find_if (test_properties_.begin(), test_properties_.end(),
                   internal::TestPropertyKeyIs(test_property.key()));
  if (property_with_matching_key == test_properties_.end()) {
    test_properties_.push_back(test_property);
    return;
  }
  property_with_matching_key->SetValue(test_property.value());
}